

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O0

int doturn(void)

{
  monst *pmVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  int local_30;
  int local_2c;
  int sp_no;
  int xlev;
  int range;
  int once;
  monst *mtmp2;
  monst *mtmp;
  
  if ((urole.malenum == 0x161) || (urole.malenum == 0x15f)) {
    u.uconduct.gnostic = u.uconduct.gnostic + 1;
    if (((u.ualign.type == -1) ||
        ((((youmonst.data)->mflags2 & 0x200) == 0 && (((youmonst.data)->mflags2 & 2) == 0)))) &&
       (u.ugangr < 7)) {
      bVar2 = In_hell(&u.uz);
      if (bVar2 == '\0') {
        pcVar5 = u_gname();
        pline("Calling upon %s, you chant an arcane formula.",pcVar5);
        exercise(2,'\x01');
        iVar3 = u.ulevel / 5 + 8;
        xlev = 0;
        pmVar1 = level->monlist;
        while (mtmp2 = pmVar1, mtmp2 != (monst *)0x0) {
          pmVar1 = mtmp2->nmon;
          if (((((0 < mtmp2->mhp) && ((viz_array[mtmp2->my][mtmp2->mx] & 2U) != 0)) &&
               (iVar4 = dist2((int)mtmp2->mx,(int)mtmp2->my,(int)u.ux,(int)u.uy),
               iVar4 <= iVar3 * iVar3)) && ((*(uint *)&mtmp2->field_0x60 >> 0x16 & 1) == 0)) &&
             (((mtmp2->data->mflags2 & 2) != 0 ||
              (((mtmp2->data->mflags2 & 0x200) != 0 && (0xf < u.ulevel)))))) {
            *(uint *)&mtmp2->field_0x60 = *(uint *)&mtmp2->field_0x60 & 0xfff7ffff;
            if (u.uprops[0x1c].intrinsic == 0) {
              iVar4 = resist(mtmp2,'\0',0,1);
              if (iVar4 == 0) {
                local_2c = 6;
                switch(mtmp2->data->mlet) {
                case '&':
                  local_2c = 8;
                case '6':
                  local_2c = local_2c + 2;
                case '0':
                  local_2c = local_2c + 2;
                case '1':
                  local_2c = local_2c + 2;
                case '\'':
                  local_2c = local_2c + 2;
switchD_002a7418_caseD_34:
                  if ((u.ulevel < local_2c) || (iVar4 = resist(mtmp2,'\0',0,0), iVar4 != 0)) {
switchD_002a7418_caseD_28:
                    monflee(mtmp2,0,'\0','\x01');
                  }
                  else if (u.ualign.type == -1) {
                    *(uint *)&mtmp2->field_0x60 =
                         *(uint *)&mtmp2->field_0x60 & 0xffbfffff | 0x400000;
                    set_malign(mtmp2);
                  }
                  else {
                    killed(mtmp2);
                  }
                  break;
                default:
                  goto switchD_002a7418_caseD_28;
                case '4':
                  goto switchD_002a7418_caseD_34;
                }
              }
            }
            else {
              if (xlev == 0) {
                pline("Unfortunately, your voice falters.");
              }
              *(uint *)&mtmp2->field_0x60 = *(uint *)&mtmp2->field_0x60 & 0xfffeffff;
              mtmp2->mfrozen = '\0';
              *(uint *)&mtmp2->field_0x60 = *(uint *)&mtmp2->field_0x60 & 0xfffbffff | 0x40000;
              xlev = xlev + 1;
            }
          }
        }
        nomul(-5,"trying to turn the monsters");
        mtmp._4_4_ = 1;
      }
      else {
        pcVar5 = u_gname();
        pline("Since you are in Gehennom, %s won\'t help you.",pcVar5);
        aggravate();
        mtmp._4_4_ = 0;
      }
    }
    else {
      u_gname();
      pline("For some reason, %s seems to ignore you.");
      aggravate();
      exercise(2,'\0');
      mtmp._4_4_ = 0;
    }
  }
  else {
    if ((objects[0x19d].field_0x10 & 1) != 0) {
      local_30 = 0;
      while( true ) {
        bVar6 = false;
        if ((local_30 < 0x2b) && (bVar6 = false, spl_book[local_30].sp_id != 0)) {
          bVar6 = spl_book[local_30].sp_id != 0x19d;
        }
        if (!bVar6) break;
        local_30 = local_30 + 1;
      }
      if ((local_30 < 0x2b) && (spl_book[local_30].sp_id == 0x19d)) {
        iVar3 = spelleffects(local_30,'\x01');
        return iVar3;
      }
    }
    pline("You don\'t know how to turn undead!");
    mtmp._4_4_ = 0;
  }
  return mtmp._4_4_;
}

Assistant:

int doturn(void)
{	/* Knights & Priest(esse)s only please */

	struct monst *mtmp, *mtmp2;
	int once, range, xlev;

	if (!Role_if (PM_PRIEST) && !Role_if(PM_KNIGHT)) {
		/* Try to use turn undead spell. */
		if (objects[SPE_TURN_UNDEAD].oc_name_known) {
		    int sp_no;
		    for (sp_no = 0; sp_no < MAXSPELL &&
			 spl_book[sp_no].sp_id != NO_SPELL &&
			 spl_book[sp_no].sp_id != SPE_TURN_UNDEAD; sp_no++);

		    if (sp_no < MAXSPELL &&
			spl_book[sp_no].sp_id == SPE_TURN_UNDEAD)
			    return spelleffects(sp_no, TRUE);
		}

		pline("You don't know how to turn undead!");
		return 0;
	}
	u.uconduct.gnostic++;

	if ((u.ualign.type != A_CHAOTIC &&
		    (is_demon(youmonst.data) || is_undead(youmonst.data))) ||
				u.ugangr > 6 /* "Die, mortal!" */) {

		pline("For some reason, %s seems to ignore you.", u_gname());
		aggravate();
		exercise(A_WIS, FALSE);
		return 0;
	}

	if (Inhell) {
	    pline("Since you are in Gehennom, %s won't help you.", u_gname());
	    aggravate();
	    return 0;
	}
	pline("Calling upon %s, you chant an arcane formula.", u_gname());
	exercise(A_WIS, TRUE);

	/* note: does not perform unturn_dead() on victims' inventories */
	range = BOLT_LIM + (u.ulevel / 5);	/* 5 to 11 */
	range *= range;
	once = 0;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
	    mtmp2 = mtmp->nmon;

	    if (DEADMONSTER(mtmp)) continue;
	    if (!cansee(mtmp->mx,mtmp->my) ||
		distu(mtmp->mx,mtmp->my) > range) continue;

	    if (!mtmp->mpeaceful && (is_undead(mtmp->data) ||
		   (is_demon(mtmp->data) && (u.ulevel > (MAXULEV/2))))) {

		    mtmp->msleeping = 0;
		    if (Confusion) {
			if (!once++)
			    pline("Unfortunately, your voice falters.");
			mtmp->mflee = 0;
			mtmp->mfrozen = 0;
			mtmp->mcanmove = 1;
		    } else if (!resist(mtmp, '\0', 0, TELL)) {
			xlev = 6;
			switch (mtmp->data->mlet) {
			    /* this is intentional, lichs are tougher
			       than zombies. */
			case S_LICH:    xlev += 2;  /*FALLTHRU*/
			case S_GHOST:   xlev += 2;  /*FALLTHRU*/
			case S_VAMPIRE: xlev += 2;  /*FALLTHRU*/
			case S_WRAITH:  xlev += 2;  /*FALLTHRU*/
			case S_MUMMY:   xlev += 2;  /*FALLTHRU*/
			case S_ZOMBIE:
			    if (u.ulevel >= xlev &&
				    !resist(mtmp, '\0', 0, NOTELL)) {
				if (u.ualign.type == A_CHAOTIC) {
				    mtmp->mpeaceful = 1;
				    set_malign(mtmp);
				} else { /* damn them */
				    killed(mtmp);
				}
				break;
			    } /* else flee */
			    /*FALLTHRU*/
			default:
			    monflee(mtmp, 0, FALSE, TRUE);
			    break;
			}
		    }
	    }
	}
	nomul(-5, "trying to turn the monsters");
	return 1;
}